

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces
          (ModelBaseEKFFlexEstimatorIMU *this,bool b)

{
  ExtendedKalmanFilter *this_00;
  IMUElasticLocalFrameDynamicalSystem *this_01;
  Index IVar1;
  
  if (this->withUnmodeledForces_ == b) {
    return;
  }
  this_01 = &this->functor_;
  IMUElasticLocalFrameDynamicalSystem::setWithUnmodeledForces(this_01,b);
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  IVar1 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(this_01);
  KalmanFilterBase::setMeasureSize(&this_00->super_KalmanFilterBase,IVar1);
  IVar1 = IMUElasticLocalFrameDynamicalSystem::getInputSize(this_01);
  ZeroDelayObserver::setInputSize((ZeroDelayObserver *)this_00,IVar1);
  this->withUnmodeledForces_ = b;
  (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
    _vptr_FlexibilityEstimatorBase[0x44])(this);
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces(bool b)
{
  if(withUnmodeledForces_ != b)
  {
    functor_.setWithUnmodeledForces(b);
    ekf_.setMeasureSize(functor_.getMeasurementSize());
    ekf_.setInputSize(functor_.getInputSize());
    withUnmodeledForces_ = b;
    updateMeasurementCovarianceMatrix_();
  }
}